

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.cpp
# Opt level: O2

spv_result_t __thiscall
spvtools::val::Function::RegisterLoopMerge(Function *this,uint32_t merge_id,uint32_t continue_id)

{
  mapped_type pBVar1;
  mapped_type *block;
  mapped_type *block_00;
  mapped_type *this_00;
  mapped_type *this_01;
  mapped_type *ppBVar2;
  iterator iVar3;
  mapped_type *this_02;
  vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *pvVar4;
  unordered_map<spvtools::val::BasicBlock_*,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>,_std::hash<spvtools::val::BasicBlock_*>,_std::equal_to<spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>_>
  *this_03;
  Construct local_f0;
  mapped_type *local_c0;
  uint32_t continue_id_local;
  uint32_t merge_id_local;
  mapped_type *local_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  _Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_68;
  _Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> local_48;
  
  continue_id_local = continue_id;
  merge_id_local = merge_id;
  RegisterBlock(this,merge_id,false);
  RegisterBlock(this,continue_id,false);
  block = std::__detail::
          _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
          ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->blocks_,&merge_id_local);
  block_00 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spvtools::val::BasicBlock>,_std::allocator<std::pair<const_unsigned_int,_spvtools::val::BasicBlock>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   *)&this->blocks_,&continue_id_local);
  if (this->current_block_ != (BasicBlock *)0x0) {
    BasicBlock::RegisterStructuralSuccessor(this->current_block_,block);
    BasicBlock::RegisterStructuralSuccessor(this->current_block_,block_00);
    BasicBlock::set_type(this->current_block_,kBlockTypeLoop);
    BasicBlock::set_type(block,kBlockTypeMerge);
    BasicBlock::set_type(block_00,kBlockTypeContinue);
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Construct::Construct
              (&local_f0,kLoop,this->current_block_,block,
               (vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *)
               &local_48);
    this_00 = (mapped_type *)AddConstruct(this,&local_f0);
    std::_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
    ~_Vector_base(&local_f0.corresponding_constructs_.
                   super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                 );
    std::_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
    ~_Vector_base(&local_48);
    local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    Construct::Construct
              (&local_f0,kContinue,block_00,(BasicBlock *)0x0,
               (vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *)
               &local_68);
    this_01 = (mapped_type *)AddConstruct(this,&local_f0);
    local_c0 = block;
    std::_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
    ~_Vector_base(&local_f0.corresponding_constructs_.
                   super__Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                 );
    std::_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
    ~_Vector_base(&local_68);
    local_88 = 0;
    uStack_80 = 0;
    local_78 = 0;
    local_f0._0_8_ = this_00;
    std::vector<spvtools::val::Construct*,std::allocator<spvtools::val::Construct*>>::
    _M_range_initialize<spvtools::val::Construct*const*>
              ((vector<spvtools::val::Construct*,std::allocator<spvtools::val::Construct*>> *)
               &local_88,&local_f0,&local_f0.corresponding_constructs_);
    Construct::set_corresponding_constructs
              ((Construct *)this_01,
               (vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *)
               &local_88);
    std::_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
    ~_Vector_base((_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                   *)&local_88);
    local_a8 = 0;
    uStack_a0 = 0;
    local_98 = 0;
    local_f0._0_8_ = this_01;
    std::vector<spvtools::val::Construct*,std::allocator<spvtools::val::Construct*>>::
    _M_range_initialize<spvtools::val::Construct*const*>
              ((vector<spvtools::val::Construct*,std::allocator<spvtools::val::Construct*>> *)
               &local_a8,&local_f0,&local_f0.corresponding_constructs_);
    Construct::set_corresponding_constructs
              ((Construct *)this_00,
               (vector<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_> *)
               &local_a8);
    std::_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>::
    ~_Vector_base((_Vector_base<spvtools::val::Construct_*,_std::allocator<spvtools::val::Construct_*>_>
                   *)&local_a8);
    pBVar1 = this->current_block_;
    local_f0._0_8_ = local_c0;
    ppBVar2 = std::__detail::
              _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_spvtools::val::BasicBlock_*>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&this->merge_block_header_,(key_type *)&local_f0);
    *ppBVar2 = pBVar1;
    this_03 = &this->continue_target_headers_;
    local_f0._0_8_ = block_00;
    iVar3 = std::
            _Hashtable<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&this_03->_M_h,(key_type *)&local_f0);
    if (iVar3.
        super__Node_iterator_base<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_false>
        ._M_cur == (__node_type *)0x0) {
      local_f0._0_8_ = this->current_block_;
      local_b0 = block_00;
      pvVar4 = (vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>> *)
               std::__detail::
               _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)this_03,&local_b0);
      std::vector<spvtools::val::BasicBlock*,std::allocator<spvtools::val::BasicBlock*>>::
      _M_assign_aux<spvtools::val::BasicBlock*const*>
                (pvVar4,&local_f0,&local_f0.corresponding_constructs_);
    }
    else {
      local_f0._0_8_ = block_00;
      this_02 = std::__detail::
                _Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                ::operator[]((_Map_base<spvtools::val::BasicBlock_*,_std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>,_std::allocator<std::pair<spvtools::val::BasicBlock_*const,_std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<spvtools::val::BasicBlock_*>,_std::hash<spvtools::val::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                              *)this_03,(key_type *)&local_f0);
      std::vector<spvtools::val::BasicBlock_*,_std::allocator<spvtools::val::BasicBlock_*>_>::
      push_back(this_02,&this->current_block_);
    }
    return SPV_SUCCESS;
  }
  __assert_fail("current_block_ && \"RegisterLoopMerge must be called when called within a block\"",
                "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/SPIRV-Tools/source/val/function.cpp"
                ,0x4a,"spv_result_t spvtools::val::Function::RegisterLoopMerge(uint32_t, uint32_t)")
  ;
}

Assistant:

spv_result_t Function::RegisterLoopMerge(uint32_t merge_id,
                                         uint32_t continue_id) {
  RegisterBlock(merge_id, false);
  RegisterBlock(continue_id, false);
  BasicBlock& merge_block = blocks_.at(merge_id);
  BasicBlock& continue_target_block = blocks_.at(continue_id);
  assert(current_block_ &&
         "RegisterLoopMerge must be called when called within a block");
  current_block_->RegisterStructuralSuccessor(&merge_block);
  current_block_->RegisterStructuralSuccessor(&continue_target_block);

  current_block_->set_type(kBlockTypeLoop);
  merge_block.set_type(kBlockTypeMerge);
  continue_target_block.set_type(kBlockTypeContinue);
  Construct& loop_construct =
      AddConstruct({ConstructType::kLoop, current_block_, &merge_block});
  Construct& continue_construct =
      AddConstruct({ConstructType::kContinue, &continue_target_block});

  continue_construct.set_corresponding_constructs({&loop_construct});
  loop_construct.set_corresponding_constructs({&continue_construct});
  merge_block_header_[&merge_block] = current_block_;
  if (continue_target_headers_.find(&continue_target_block) ==
      continue_target_headers_.end()) {
    continue_target_headers_[&continue_target_block] = {current_block_};
  } else {
    continue_target_headers_[&continue_target_block].push_back(current_block_);
  }

  return SPV_SUCCESS;
}